

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

int __thiscall
cxxopts::values::
standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
clone(standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_18;
  standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  this_local = this;
  std::
  make_shared<cxxopts::values::standard_value<std::__cxx11::string>,cxxopts::values::standard_value<std::__cxx11::string>const&>
            ((standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&stack0xffffffffffffffd8);
  std::shared_ptr<cxxopts::Value>::
  shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,void>
            ((shared_ptr<cxxopts::Value> *)this,
             (shared_ptr<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xffffffffffffffd8);
  std::
  shared_ptr<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~shared_ptr((shared_ptr<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffffd8);
  return (int)this;
}

Assistant:

const override
      {
        return std::make_shared<standard_value<T>>(*this);
      }